

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O3

void test_archive_string(void)

{
  archive_string *paVar1;
  archive_string local_a8;
  archive_string local_88;
  archive_string local_68;
  archive_string local_48;
  
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'7',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'7',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'7',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_string_ensure(&local_68,5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L':',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L';',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L';',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L';',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x1f);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'>',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT - 1)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'?',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'?',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'?',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x20);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'A',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'B',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'B',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'B',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  paVar1 = archive_string_ensure(&local_68,0x21);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'D',(uint)(&local_68 == paVar1),"&s == archive_string_ensure(&s, EXTENT + 1)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'E',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'E',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'E',(uint)(local_68.s != (char *)0x0),"NULL != (s).s",(void *)0x0);
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'N',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'N',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'N',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Q',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'R',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'R',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'R',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'U',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'V',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'V',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'V',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"fubar");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Y',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"fubar\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Z',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Z',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Z',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strcat(&local_68,"baz");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L']',(uint)(&local_68 == paVar1),"&s == archive_strcat(&s, \"baz\")",(void *)0x0
                  );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'^',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'^',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'^',"fubarbaz","\"fubarbaz\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'g',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'g',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'g',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  archive_strappend_char(&local_68,'X');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'k',1,"1",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'k',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'k',"X","\"X\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  archive_strappend_char(&local_68,'Y');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'o',2,"2",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'o',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'o',"XY","\"XY\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'|',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'|',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'|',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x7f',(uint)(&local_68 == paVar1),"&s == archive_strncat(&s, \"snafu\", 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x80',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x80',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x80',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"barbazqux",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x83',(uint)(&local_68 == paVar1),
                   "&s == archive_strncat(&s, \"barbazqux\", 3)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x84',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x84',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x84',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  paVar1 = archive_strncat(&local_68,"snafu",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x87',(uint)(&local_68 == paVar1),"&s == archive_strncat(&s, \"snafu\", 8)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x88',0xd,"13",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x88',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x88',"snafubarsnafu","\"snafubarsnafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x91',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x91',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x91',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x94',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"fubar\", 5)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x95',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x95',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x95',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x98',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"snafubar\", 5)"
                   ,(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x99',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x99',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x99',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x9c',(uint)(&local_68 == paVar1),"&s == archive_strncpy(&s, \"snafu\", 8)",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9d',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9d',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x9d',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¦',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¦',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¦',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'©',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"snafu\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ª',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ª',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ª',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"foo",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'­',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"foo\")",
                   (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'®',3,"3",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'®',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'®',"foo","\"foo\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'±',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'²',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'²',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'²',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'»',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'»',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  local_a8.s = (char *)0x0;
  local_a8.length = 0;
  local_a8.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'½',0,"0",0,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'½',0,"0",0,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'½',(char *)0x0,"((void*)0)",(char *)0x0,"(t).s",(void *)0x0,L'\0');
  local_88.s = (char *)0x0;
  local_88.length = 0;
  local_88.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¿',0,"0",0,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¿',0,"0",0,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¿',(char *)0x0,"((void*)0)",(char *)0x0,"(u).s",(void *)0x0,L'\0');
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Á',0,"0",0,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Á',0,"0",0,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Á',(char *)0x0,"((void*)0)",(char *)0x0,"(v).s",(void *)0x0,L'\0');
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Å',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Å',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Å',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Æ',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Æ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Æ',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'É',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  archive_string_concat(&local_88,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ë',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ë',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ë',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ì',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ì',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ì',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"foo",3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ï',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"foo\")",
                   (void *)0x0);
  archive_string_concat(&local_48,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ñ',3,"3",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ñ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ñ',"foo","\"foo\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ò',3,"3",local_48.length,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ò',0x20,"32",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ò',"foo","\"foo\"",local_48.s,"(v).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Õ',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"\")",(void *)0x0);
  local_a8.length = 0;
  paVar1 = archive_strncat(&local_a8,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ö',(uint)(&local_a8 == paVar1),"&t == archive_strcpy(&t, \"\")",(void *)0x0);
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ø',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ø',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ø',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ù',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ù',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ù',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafu",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ü',(uint)(&local_68 == paVar1),"&s == archive_strcpy(&s, \"snafu\")",
                   (void *)0x0);
  local_a8.length = 0;
  paVar1 = archive_strncat(&local_a8,"",0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ý',(uint)(&local_a8 == paVar1),"&t == archive_strcpy(&t, \"\")",(void *)0x0);
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ß',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ß',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ß',"snafu","\"snafu\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'à',5,"5",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'à',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'à',"snafu","\"snafu\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.s = (char *)0x0;
  local_68.length = 0;
  local_68.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'é',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'é',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'é',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  local_a8.s = (char *)0x0;
  local_a8.length = 0;
  local_a8.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ë',0,"0",0,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ë',0,"0",0,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ë',(char *)0x0,"((void*)0)",(char *)0x0,"(t).s",(void *)0x0,L'\0');
  local_88.s = (char *)0x0;
  local_88.length = 0;
  local_88.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'í',0,"0",0,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'í',0,"0",0,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'í',(char *)0x0,"((void*)0)",(char *)0x0,"(u).s",(void *)0x0,L'\0');
  local_48.s = (char *)0x0;
  local_48.length = 0;
  local_48.buffer_length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ï',0,"0",0,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ï',0,"0",0,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ï',(char *)0x0,"((void*)0)",(char *)0x0,"(v).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ó',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ó',0,"0",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ó',(char *)0x0,"((void*)0)",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ô',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ô',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ô',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_88.length = 0;
  archive_string_concat(&local_88,&local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ø',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ø',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ø',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ù',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ù',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_88.length = 0;
  archive_string_concat(&local_88,&local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ý',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ý',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'þ',0,"0",local_88.length,"(u).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'þ',0x20,"32",local_88.buffer_length,"(u).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'þ',"","\"\"",local_88.s,"(u).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"snafubar",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'ā',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"snafubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ă',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ă',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ă',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_48.length = 0;
  archive_string_concat(&local_48,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ą',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ą',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ą',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ć',8,"8",local_48.length,"(v).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ć',0x20,"32",local_48.buffer_length,"(v).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ć',"snafubar","\"snafubar\"",local_48.s,"(v).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0,"0",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĉ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĉ',"","\"\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ċ',8,"8",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ċ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ċ',"snafubar","\"snafubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Č',8,"8",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Č',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Č',"snafubar","\"snafubar\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.length = 0;
  paVar1 = archive_strncat(&local_68,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'ď',(uint)(paVar1 != (archive_string *)0x0),
                   "NULL != archive_strcpy(&s, \"fubar\")",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Đ',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Đ',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Đ',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_a8.length = 0;
  archive_string_concat(&local_a8,&local_68);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ē',5,"5",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ē',0x20,"32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ē',"fubar","\"fubar\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĕ',5,"5",local_a8.length,"(t).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĕ',0x20,"32",local_a8.buffer_length,"(t).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĕ',"fubar","\"fubar\"",local_a8.s,"(t).s",(void *)0x0,L'\0');
  local_68.buffer_length = 0;
  local_68.s = (char *)0x0;
  local_68.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ī',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ī',0,"0",0,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ī',(char *)0x0,"((void*)0)",(char *)0x0,"(s).s",(void *)0x0,L'\0');
  archive_string_sprintf(&local_68,"%s","");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Į',0,"0",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Į',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Į',"","\"\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%s","0123456789abcdef0123456789abcdef");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĳ',0x20,"32",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ĳ',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ĳ',"0123456789abcdef0123456789abcdef","s32",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%s","0123456789abcdef0123456789abcdef0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ķ',0x21,"33",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ķ',0x40,"2 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ķ',"0123456789abcdef0123456789abcdef0","s33",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s","0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĺ',0x40,"64",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ĺ',0x80,"4 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ĺ',"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef","s64",
             local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s","0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ľ',0x41,"65",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ľ',0x80,"4 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ľ',"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0","s65",
             local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s",
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
            );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ł',0x80,"128",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ł',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ł',
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
             ,"s128",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf
            (&local_68,"%s",
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0"
            );
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ņ',0x81,"129",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'ņ',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'ņ',
             "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0"
             ,"s129",local_68.s,"(s).s",(void *)0x0,L'\0');
  local_68.length = 0;
  archive_string_sprintf(&local_68,"%d",0x499602d2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ŋ',10,"10",local_68.length,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ŋ',0x100,"8 * 32",local_68.buffer_length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'Ŋ',"1234567890","\"1234567890\"",local_68.s,"(s).s",(void *)0x0,L'\0');
  return;
}

Assistant:

static void
test_archive_string_ensure(void)
{
	struct archive_string s;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);

	/* single-extent allocation */
	assert(&s == archive_string_ensure(&s, 5));
	assertNonNULLString(0, EXTENT, s);

	/* what happens around extent boundaries? */
	assert(&s == archive_string_ensure(&s, EXTENT - 1));
	assertNonNULLString(0, EXTENT, s);

	assert(&s == archive_string_ensure(&s, EXTENT));
	assertNonNULLString(0, EXTENT, s);

	assert(&s == archive_string_ensure(&s, EXTENT + 1));
	assertNonNULLString(0, 2 * EXTENT, s);
}